

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  typed_value<int,_char> *ptVar4;
  typed_value<unsigned_int,_char> *ptVar5;
  typed_value<float,_char> *ptVar6;
  typed_value<bool,_char> *ptVar7;
  size_type sVar8;
  any *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  ostream *poVar10;
  variables_map *this;
  bool bVar11;
  allocator local_611;
  float local_610;
  int local_60c;
  int local_608;
  float local_604;
  float local_600;
  int argc_local;
  key_type local_5f8;
  char **argv_local;
  key_type local_5c8;
  key_type local_5a8;
  key_type local_588;
  key_type local_568;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_548;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_510 [3];
  ifstream config;
  options_description opts;
  variables_map local_1f8 [160];
  variables_map local_158 [160];
  variables_map local_b8 [160];
  
  argc_local = argc;
  argv_local = argv;
  dynet::initialize(&argc_local,&argv_local,false);
  boost::program_options::variables_map::variables_map(&vm);
  std::__cxx11::string::string((string *)&config,"Allowed options",(allocator *)&local_5f8);
  boost::program_options::options_description::options_description
            (&opts,(string *)&config,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&config);
  _config = (pointer)boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&config,"help");
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"config,c",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"train,t",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"devel,d",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"test,T",(char *)ptVar3);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"rescore,r");
  ptVar4 = boost::program_options::value<int>();
  local_5f8._M_dataplus._M_p._0_4_ = 0;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value(ptVar4,(int *)&local_5f8);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"beam,b",(char *)ptVar4);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"kbest,K",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"initialise,i",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"parameters,p",(char *)ptVar3);
  ptVar4 = boost::program_options::value<int>();
  local_5c8._M_dataplus._M_p._0_4_ = LAYERS;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value(ptVar4,(int *)&local_5c8);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"layers,l",(char *)ptVar4);
  ptVar4 = boost::program_options::value<int>();
  local_568._M_dataplus._M_p._0_4_ = ALIGN_DIM;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value(ptVar4,(int *)&local_568);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"align,a",(char *)ptVar4);
  ptVar4 = boost::program_options::value<int>();
  local_588._M_dataplus._M_p._0_4_ = HIDDEN_DIM;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value(ptVar4,(int *)&local_588);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"hidden,h",(char *)ptVar4);
  ptVar5 = boost::program_options::value<unsigned_int>();
  local_5a8._M_dataplus._M_p._0_4_ = 0;
  ptVar5 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                     (ptVar5,(uint *)&local_5a8);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"sgd_trainer",(char *)ptVar5);
  ptVar6 = boost::program_options::value<float>();
  local_600 = 0.01;
  ptVar6 = boost::program_options::typed_value<float,_char>::default_value(ptVar6,&local_600);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"lr_eta",(char *)ptVar6);
  ptVar6 = boost::program_options::value<float>();
  local_604 = 2.0;
  ptVar6 = boost::program_options::typed_value<float,_char>::default_value(ptVar6,&local_604);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"lr_eta_decay",(char *)ptVar6);
  ptVar7 = boost::program_options::value<bool>();
  local_611 = (allocator)0x1;
  ptVar7 = boost::program_options::typed_value<bool,_char>::default_value(ptVar7,(bool *)&local_611)
  ;
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"sparse_updates",(char *)ptVar7);
  ptVar4 = boost::program_options::value<int>();
  local_608 = 100;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value(ptVar4,&local_608);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"topk,k",(char *)ptVar4);
  ptVar4 = boost::program_options::value<int>();
  local_60c = 0x32;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value(ptVar4,&local_60c);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"epochs,e",(char *)ptVar4);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar2,"gru");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar2,"lstm");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"bidirectional");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar2,"giza");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"gz-position");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"gz-markov");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"gz-fertility");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"curriculum");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar2,"swap");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"document,D");
  ptVar6 = boost::program_options::value<float>();
  local_610 = 0.0;
  ptVar6 = boost::program_options::typed_value<float,_char>::default_value(ptVar6,&local_610);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"coverage,C",(char *)ptVar6);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"fertility,f");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"fert-stats,F");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,"display");
  boost::program_options::options_description_easy_init::operator()(pcVar2,"verbose,v");
  local_548.super_function_base.vtable = (vtable_base *)0x0;
  local_548.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_548.super_function_base.functor._8_8_ = 0;
  local_548.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&config,argc_local,argv_local,&opts,0,&local_548);
  boost::program_options::store(&config,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&config);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_548);
  std::__cxx11::string::string((string *)&config,"config",(allocator *)&local_5f8);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_510,(key_type *)&config);
  std::__cxx11::string::~string((string *)&config);
  if (sVar8 != 0) {
    std::__cxx11::string::string((string *)&local_5f8,"config",(allocator *)&local_5c8);
    operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
    pbVar9 = boost::any_cast<std::__cxx11::string_const&>(operand);
    std::ifstream::ifstream(&config,(pbVar9->_M_dataplus)._M_p,_S_in);
    std::__cxx11::string::~string((string *)&local_5f8);
    boost::program_options::parse_config_file<char>
              ((istream *)&local_5f8,(options_description *)&config,SUB81(&opts,0));
    boost::program_options::store((basic_parsed_options *)&local_5f8,&vm,false);
    std::
    vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
    ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
               *)&local_5f8);
    std::ifstream::~ifstream(&config);
  }
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)&config,"help",(allocator *)&local_600);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_510,(key_type *)&config);
  if (sVar8 == 0) {
    std::__cxx11::string::string((string *)&local_5f8,"train",(allocator *)&local_604);
    sVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_510,&local_5f8);
    if (sVar8 != 1) {
      std::__cxx11::string::~string((string *)&local_5f8);
      goto LAB_0012eabd;
    }
    std::__cxx11::string::string((string *)&local_5c8,"devel",(allocator *)&local_608);
    sVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_510,&local_5c8);
    if (sVar8 == 1) {
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5f8);
      std::__cxx11::string::~string((string *)&config);
LAB_0012ebf4:
      std::__cxx11::string::string((string *)&config,"lstm",(allocator *)&local_5f8);
      sVar8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_510,(key_type *)&config);
      std::__cxx11::string::~string((string *)&config);
      if (sVar8 == 0) {
        std::__cxx11::string::string((string *)&config,"gru",(allocator *)&local_5f8);
        sVar8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_510,(key_type *)&config);
        std::__cxx11::string::~string((string *)&config);
        if (sVar8 == 0) {
          this = local_1f8;
          boost::program_options::variables_map::variables_map(this,&vm);
          iVar1 = main_body<dynet::SimpleRNNBuilder>(this);
        }
        else {
          this = local_158;
          boost::program_options::variables_map::variables_map(this,&vm);
          iVar1 = main_body<dynet::GRUBuilder>(this);
        }
      }
      else {
        this = local_b8;
        boost::program_options::variables_map::variables_map(this,&vm);
        iVar1 = main_body<dynet::LSTMBuilder>(this);
      }
      boost::program_options::variables_map::~variables_map(this);
      goto LAB_0012eaf0;
    }
    std::__cxx11::string::string((string *)&local_568,"test",(allocator *)&local_60c);
    sVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_510,&local_568);
    if (sVar8 == 0) {
      bVar11 = false;
    }
    else {
      std::__cxx11::string::string((string *)&local_588,"kbest",(allocator *)&local_610);
      sVar8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_510,&local_588);
      if (sVar8 == 0) {
        bVar11 = false;
      }
      else {
        std::__cxx11::string::string((string *)&local_5a8,"fert-stats",&local_611);
        sVar8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count(local_510,&local_5a8);
        bVar11 = sVar8 != 0;
        std::__cxx11::string::~string((string *)&local_5a8);
      }
      std::__cxx11::string::~string((string *)&local_588);
    }
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&config);
    if (!bVar11) goto LAB_0012ebf4;
  }
  else {
LAB_0012eabd:
    std::__cxx11::string::~string((string *)&config);
  }
  poVar10 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&opts);
  std::operator<<(poVar10,"\n");
  iVar1 = 1;
LAB_0012eaf0:
  boost::program_options::options_description::~options_description(&opts);
  boost::program_options::variables_map::~variables_map(&vm);
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
    dynet::initialize(argc, argv);

    // command line processing
    variables_map vm; 
    options_description opts("Allowed options");
    opts.add_options()
        ("help", "print help message")
        ("config,c", value<string>(), "config file specifying additional command line options")
        ("train,t", value<string>(), "file containing training sentences, with "
            "each line consisting of source ||| target.")
        ("devel,d", value<string>(), "file containing development sentences.")
        ("test,T", value<string>(), "file containing testing sentences")
        ("rescore,r", "rescore (source, target) pairs in testing, default: translate source only")
        ("beam,b", value<int>()->default_value(0), "size of beam in decoding; 0=greedy")
        ("kbest,K", value<string>(), "test on kbest inputs using mononlingual Markov model")
        ("initialise,i", value<string>(), "load initial parameters from file")
        ("parameters,p", value<string>(), "save best parameters to this file")
        ("layers,l", value<int>()->default_value(LAYERS), "use <num> layers for RNN components")
        ("align,a", value<int>()->default_value(ALIGN_DIM), "use <num> dimensions for alignment projection")
        ("hidden,h", value<int>()->default_value(HIDDEN_DIM), "use <num> dimensions for recurrent hidden states")
	("sgd_trainer", value<unsigned>()->default_value(0), "use specific SGD trainer (0: vanilla SGD; 1: momentum SGD; 2: Adagrad; 3: AdaDelta; 4: Adam)")
	("lr_eta", value<float>()->default_value(0.01f), "SGD learning rate value (e.g., 0.01 for simple SGD trainer)")
        ("lr_eta_decay", value<float>()->default_value(2.0f), "SGD learning rate decay value")
	("sparse_updates", value<bool>()->default_value(true), "enable/disable sparse update(s) for lookup parameter(s)")
        ("topk,k", value<int>()->default_value(100), "use <num> top kbest entries, used with --kbest")
        ("epochs,e", value<int>()->default_value(50), "maximum number of training epochs")
        ("gru", "use Gated Recurrent Unit (GRU) for recurrent structure; default RNN")
        ("lstm", "use Long Short Term Memory (GRU) for recurrent structure; default RNN")
        ("bidirectional", "use bidirectional recurrent hidden states as source embeddings, rather than word embeddings")
        ("giza", "use GIZA++ style features in attentional components (corresponds to all of the 'gz' options)")
        ("gz-position", "use GIZA++ positional index features")
        ("gz-markov", "use GIZA++ markov context features")
        ("gz-fertility", "use GIZA++ fertility type features")
        ("curriculum", "use 'curriculum' style learning, focusing on easy problems in earlier epochs")
        ("swap", "swap roles of source and target, i.e., learn p(source|target)")
        ("document,D", "use previous sentence as document context; requires document id prefix in input files")
        ("coverage,C", value<float>()->default_value(0.0f), "impose alignment coverage penalty in training, with given coefficient")
        ("fertility,f", "learn Normal model of word fertility values")
        ("fert-stats,F", "display computed fertility values on the development set")
        ("display", "just display alignments instead of training or decoding")
        ("verbose,v", "be extremely chatty")
    ;
    store(parse_command_line(argc, argv, opts), vm); 
    if (vm.count("config") > 0)
    {
        ifstream config(vm["config"].as<string>().c_str());
        store(parse_config_file(config, opts), vm); 
    }
    notify(vm);
    
    if (vm.count("help") || vm.count("train") != 1 || (vm.count("devel") != 1 && !(vm.count("test") == 0 || vm.count("kbest") == 0 || vm.count("fert-stats") == 0))) {
        cout << opts << "\n";
        return 1;
    }

    if (vm.count("lstm"))
	return main_body<LSTMBuilder>(vm);
    else if (vm.count("gru"))
	return main_body<GRUBuilder>(vm);
    else
	return main_body<SimpleRNNBuilder>(vm);
}